

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.h
# Opt level: O2

bool __thiscall
ASDCP::MXF::FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::MXF::Primer::LocalTagEntry>_>::
Archive(FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::MXF::Primer::LocalTagEntry>_> *this,
       MemIOWriter *Writer)

{
  bool bVar1;
  byte bVar2;
  _Base_ptr p_Var3;
  
  bVar1 = Kumu::MemIOWriter::WriteUi32BE
                    (Writer,(ui32_t)(this->super_PushSet<ASDCP::MXF::Primer::LocalTagEntry>).
                                    super_set<ASDCP::MXF::Primer::LocalTagEntry,_std::less<ASDCP::MXF::Primer::LocalTagEntry>,_std::allocator<ASDCP::MXF::Primer::LocalTagEntry>_>
                                    ._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if (bVar1) {
    bVar1 = Kumu::MemIOWriter::WriteUi32BE(Writer,0x12);
    if (bVar1) {
      if ((this->super_PushSet<ASDCP::MXF::Primer::LocalTagEntry>).
          super_set<ASDCP::MXF::Primer::LocalTagEntry,_std::less<ASDCP::MXF::Primer::LocalTagEntry>,_std::allocator<ASDCP::MXF::Primer::LocalTagEntry>_>
          ._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        bVar2 = 1;
      }
      else {
        p_Var3 = (this->super_PushSet<ASDCP::MXF::Primer::LocalTagEntry>).
                 super_set<ASDCP::MXF::Primer::LocalTagEntry,_std::less<ASDCP::MXF::Primer::LocalTagEntry>,_std::allocator<ASDCP::MXF::Primer::LocalTagEntry>_>
                 ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        bVar2 = 1;
        while (((_Rb_tree_header *)p_Var3 !=
                &(this->super_PushSet<ASDCP::MXF::Primer::LocalTagEntry>).
                 super_set<ASDCP::MXF::Primer::LocalTagEntry,_std::less<ASDCP::MXF::Primer::LocalTagEntry>,_std::allocator<ASDCP::MXF::Primer::LocalTagEntry>_>
                 ._M_t._M_impl.super__Rb_tree_header && ((bVar2 & 1) != 0))) {
          bVar2 = (**(code **)(*(long *)(p_Var3 + 1) + 0x20))(p_Var3 + 1,Writer);
          p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
        }
      }
      goto LAB_0019d6f5;
    }
  }
  bVar2 = 0;
LAB_0019d6f5:
  return (bool)(bVar2 & 1);
}

Assistant:

bool Archive(Kumu::MemIOWriter* Writer) const {
	    if ( ! Writer->WriteUi32BE((ui32_t)this->size()) ) return false;
	    if ( ! Writer->WriteUi32BE((ui32_t)this->ItemSize()) ) return false;
	    if ( this->empty() ) return true;
	    
	    typename ContainerType::const_iterator i;
	    bool result = true;
	    for ( i = this->begin(); i != this->end() && result; ++i )
	      {
		result = i->Archive(Writer);
	      }

	    return result;
	  }